

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestOneofParsingLite::Clear(TestOneofParsingLite *this)

{
  uint32_t cached_has_bits;
  TestOneofParsingLite *this_local;
  
  clear_oneof_field(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneofParsingLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestOneofParsingLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_oneof_field();
  _internal_metadata_.Clear<std::string>();
}